

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Token.cpp
# Opt level: O0

Token * __thiscall hdc::Token::getKindAsPrettyString_abi_cxx11_(Token *this)

{
  undefined4 *in_RSI;
  Token *this_local;
  string *kind_as_str;
  
  std::__cxx11::string::string((string *)this);
  switch(*in_RSI) {
  case 0:
    std::__cxx11::string::operator=((string *)this,"def");
    break;
  case 1:
    std::__cxx11::string::operator=((string *)this,"class");
    break;
  case 2:
    std::__cxx11::string::operator=((string *)this,"var");
    break;
  case 3:
    std::__cxx11::string::operator=((string *)this,"const");
    break;
  case 4:
    std::__cxx11::string::operator=((string *)this,"struct");
    break;
  case 5:
    std::__cxx11::string::operator=((string *)this,"enum");
    break;
  case 6:
    std::__cxx11::string::operator=((string *)this,"union");
    break;
  case 7:
    std::__cxx11::string::operator=((string *)this,"if");
    break;
  case 8:
    std::__cxx11::string::operator=((string *)this,"elif");
    break;
  case 9:
    std::__cxx11::string::operator=((string *)this,"else");
    break;
  case 10:
    std::__cxx11::string::operator=((string *)this,"for");
    break;
  case 0xb:
    std::__cxx11::string::operator=((string *)this,"while");
    break;
  case 0xc:
    std::__cxx11::string::operator=((string *)this,"continue");
    break;
  case 0xd:
    std::__cxx11::string::operator=((string *)this,"return");
    break;
  case 0xe:
    std::__cxx11::string::operator=((string *)this,"goto");
    break;
  case 0xf:
    std::__cxx11::string::operator=((string *)this,"break");
    break;
  case 0x10:
    std::__cxx11::string::operator=((string *)this,"yield");
    break;
  case 0x11:
    std::__cxx11::string::operator=((string *)this,"from");
    break;
  case 0x12:
    std::__cxx11::string::operator=((string *)this,"as");
    break;
  case 0x13:
    std::__cxx11::string::operator=((string *)this,"import");
    break;
  case 0x14:
    std::__cxx11::string::operator=((string *)this,"do");
    break;
  case 0x15:
    std::__cxx11::string::operator=((string *)this,"in");
    break;
  case 0x16:
    std::__cxx11::string::operator=((string *)this,"pass");
    break;
  case 0x17:
    std::__cxx11::string::operator=((string *)this,"new");
    break;
  case 0x18:
    std::__cxx11::string::operator=((string *)this,"delete");
    break;
  case 0x19:
    std::__cxx11::string::operator=((string *)this,"case");
    break;
  case 0x1a:
    std::__cxx11::string::operator=((string *)this,"default");
    break;
  case 0x1b:
    std::__cxx11::string::operator=((string *)this,"with");
    break;
  case 0x1c:
    std::__cxx11::string::operator=((string *)this,"sizeof");
    break;
  case 0x1d:
    std::__cxx11::string::operator=((string *)this,"and");
    break;
  case 0x1e:
    std::__cxx11::string::operator=((string *)this,"or");
    break;
  case 0x1f:
    std::__cxx11::string::operator=((string *)this,"not");
    break;
  case 0x20:
    std::__cxx11::string::operator=((string *)this,"u8");
    break;
  case 0x21:
    std::__cxx11::string::operator=((string *)this,"u16");
    break;
  case 0x22:
    std::__cxx11::string::operator=((string *)this,"u32");
    break;
  case 0x23:
    std::__cxx11::string::operator=((string *)this,"u64");
    break;
  case 0x24:
    std::__cxx11::string::operator=((string *)this,"i8");
    break;
  case 0x25:
    std::__cxx11::string::operator=((string *)this,"i16");
    break;
  case 0x26:
    std::__cxx11::string::operator=((string *)this,"i32");
    break;
  case 0x27:
    std::__cxx11::string::operator=((string *)this,"i64");
    break;
  case 0x28:
    std::__cxx11::string::operator=((string *)this,"void");
    break;
  case 0x29:
    std::__cxx11::string::operator=((string *)this,"symbol");
    break;
  case 0x2a:
    std::__cxx11::string::operator=((string *)this,"bool");
    break;
  case 0x2b:
    std::__cxx11::string::operator=((string *)this,"uchar");
    break;
  case 0x2c:
    std::__cxx11::string::operator=((string *)this,"char");
    break;
  case 0x2d:
    std::__cxx11::string::operator=((string *)this,"ushort");
    break;
  case 0x2e:
    std::__cxx11::string::operator=((string *)this,"short");
    break;
  case 0x2f:
    std::__cxx11::string::operator=((string *)this,"uint");
    break;
  case 0x30:
    std::__cxx11::string::operator=((string *)this,"int");
    break;
  case 0x31:
    std::__cxx11::string::operator=((string *)this,"ulong");
    break;
  case 0x32:
    std::__cxx11::string::operator=((string *)this,"long");
    break;
  case 0x33:
    std::__cxx11::string::operator=((string *)this,"float");
    break;
  case 0x34:
    std::__cxx11::string::operator=((string *)this,"double");
    break;
  case 0x35:
    std::__cxx11::string::operator=((string *)this,"identifier");
    break;
  case 0x36:
    std::__cxx11::string::operator=((string *)this,"true");
    break;
  case 0x37:
    std::__cxx11::string::operator=((string *)this,"false");
    break;
  case 0x38:
    std::__cxx11::string::operator=((string *)this,"null");
    break;
  case 0x39:
    std::__cxx11::string::operator=((string *)this,"literal char");
    break;
  case 0x3a:
    std::__cxx11::string::operator=((string *)this,"literal integer");
    break;
  case 0x3b:
    std::__cxx11::string::operator=((string *)this,"literal float");
    break;
  case 0x3c:
    std::__cxx11::string::operator=((string *)this,"literal double");
    break;
  case 0x3d:
    std::__cxx11::string::operator=((string *)this,"literal string");
    break;
  case 0x3e:
    std::__cxx11::string::operator=((string *)this,"literal symbol");
    break;
  case 0x3f:
    std::__cxx11::string::operator=((string *)this,"+");
    break;
  case 0x40:
    std::__cxx11::string::operator=((string *)this,"-");
    break;
  case 0x41:
    std::__cxx11::string::operator=((string *)this,"*");
    break;
  case 0x42:
    std::__cxx11::string::operator=((string *)this,"/");
    break;
  case 0x43:
    std::__cxx11::string::operator=((string *)this,"//");
    break;
  case 0x44:
    std::__cxx11::string::operator=((string *)this,"%");
    break;
  case 0x45:
    std::__cxx11::string::operator=((string *)this,"**");
    break;
  case 0x46:
    std::__cxx11::string::operator=((string *)this,"++");
    break;
  case 0x47:
    std::__cxx11::string::operator=((string *)this,"--");
    break;
  case 0x48:
    std::__cxx11::string::operator=((string *)this,"&");
    break;
  case 0x49:
    std::__cxx11::string::operator=((string *)this,"~");
    break;
  case 0x4a:
    std::__cxx11::string::operator=((string *)this,"|");
    break;
  case 0x4b:
    std::__cxx11::string::operator=((string *)this,"^");
    break;
  case 0x4c:
    std::__cxx11::string::operator=((string *)this,"<<");
    break;
  case 0x4d:
    std::__cxx11::string::operator=((string *)this,">>>");
    break;
  case 0x4e:
    std::__cxx11::string::operator=((string *)this,">>");
    break;
  case 0x4f:
    std::__cxx11::string::operator=((string *)this,"->");
    break;
  case 0x50:
    std::__cxx11::string::operator=((string *)this,".");
    break;
  case 0x51:
    std::__cxx11::string::operator=((string *)this,"$");
    break;
  case 0x52:
    std::__cxx11::string::operator=((string *)this,"::");
    break;
  case 0x53:
    std::__cxx11::string::operator=((string *)this,"..");
    break;
  case 0x54:
    std::__cxx11::string::operator=((string *)this,"...");
    break;
  case 0x55:
    std::__cxx11::string::operator=((string *)this,"==");
    break;
  case 0x56:
    std::__cxx11::string::operator=((string *)this,"!=");
    break;
  case 0x57:
    std::__cxx11::string::operator=((string *)this,">");
    break;
  case 0x58:
    std::__cxx11::string::operator=((string *)this,"<");
    break;
  case 0x59:
    std::__cxx11::string::operator=((string *)this,">=");
    break;
  case 0x5a:
    std::__cxx11::string::operator=((string *)this,"<=");
    break;
  case 0x5b:
    std::__cxx11::string::operator=((string *)this,"&&");
    break;
  case 0x5c:
    std::__cxx11::string::operator=((string *)this,"||");
    break;
  case 0x5d:
    std::__cxx11::string::operator=((string *)this,"!");
    break;
  case 0x5e:
    std::__cxx11::string::operator=((string *)this,"?");
    break;
  case 0x5f:
    std::__cxx11::string::operator=((string *)this,"=");
    break;
  case 0x60:
    std::__cxx11::string::operator=((string *)this,"&=");
    break;
  case 0x61:
    std::__cxx11::string::operator=((string *)this,"^=");
    break;
  case 0x62:
    std::__cxx11::string::operator=((string *)this,"|=");
    break;
  case 99:
    std::__cxx11::string::operator=((string *)this,"~=");
    break;
  case 100:
    std::__cxx11::string::operator=((string *)this,"/=");
    break;
  case 0x65:
    std::__cxx11::string::operator=((string *)this,"//=");
    break;
  case 0x66:
    std::__cxx11::string::operator=((string *)this,"-=");
    break;
  case 0x67:
    std::__cxx11::string::operator=((string *)this,"%=");
    break;
  case 0x68:
    std::__cxx11::string::operator=((string *)this,"+=");
    break;
  case 0x69:
    std::__cxx11::string::operator=((string *)this,"*=");
    break;
  case 0x6a:
    std::__cxx11::string::operator=((string *)this,"<<=");
    break;
  case 0x6b:
    std::__cxx11::string::operator=((string *)this,">>=");
    break;
  case 0x6c:
    std::__cxx11::string::operator=((string *)this,">>>=");
    break;
  case 0x6d:
    std::__cxx11::string::operator=((string *)this,":=");
    break;
  case 0x6e:
    std::__cxx11::string::operator=((string *)this,"=>");
    break;
  case 0x6f:
    std::__cxx11::string::operator=((string *)this,"\\n");
    break;
  case 0x70:
    std::__cxx11::string::operator=((string *)this,"EOF");
    break;
  case 0x71:
    std::__cxx11::string::operator=((string *)this,"@");
    break;
  case 0x72:
    std::__cxx11::string::operator=((string *)this,"begin");
    break;
  case 0x73:
    std::__cxx11::string::operator=((string *)this,"end");
    break;
  case 0x74:
    std::__cxx11::string::operator=((string *)this,":");
    break;
  case 0x75:
    std::__cxx11::string::operator=((string *)this,",");
    break;
  case 0x76:
    std::__cxx11::string::operator=((string *)this,";");
    break;
  case 0x77:
    std::__cxx11::string::operator=((string *)this,"{");
    break;
  case 0x78:
    std::__cxx11::string::operator=((string *)this,"(");
    break;
  case 0x79:
    std::__cxx11::string::operator=((string *)this,"[");
    break;
  case 0x7a:
    std::__cxx11::string::operator=((string *)this,"}");
    break;
  case 0x7b:
    std::__cxx11::string::operator=((string *)this,")");
    break;
  case 0x7c:
    std::__cxx11::string::operator=((string *)this,"]");
  }
  return this;
}

Assistant:

std::string Token::getKindAsPrettyString() {
    std::string kind_as_str;

    switch (kind) {
    case TK_DEF:
        kind_as_str = "def";
        break;

    case TK_CLASS:
        kind_as_str = "class";
        break;

    case TK_VAR:
        kind_as_str = "var";
        break;

    case TK_CONSTANT:
        kind_as_str = "const";
        break;


    case TK_STRUCT:
        kind_as_str = "struct";
        break;

    case TK_ENUM:
        kind_as_str = "enum";
        break;

    case TK_UNION:
        kind_as_str = "union";
        break;


    case TK_IF:
        kind_as_str = "if";
        break;

    case TK_ELIF:
        kind_as_str = "elif";
        break;

    case TK_ELSE:
        kind_as_str = "else";
        break;


    case TK_FOR:
        kind_as_str = "for";
        break;

    case TK_WHILE:
        kind_as_str = "while";
        break;


    case TK_CONTINUE:
        kind_as_str = "continue";
        break;

    case TK_RETURN:
        kind_as_str = "return";
        break;

    case TK_GOTO:
        kind_as_str = "goto";
        break;

    case TK_BREAK:
        kind_as_str = "break";
        break;

    case TK_YIELD:
        kind_as_str = "yield";
        break;


    case TK_FROM:
        kind_as_str = "from";
        break;

    case TK_AS:
        kind_as_str = "as";
        break;

    case TK_IMPORT:
        kind_as_str = "import";
        break;

    case TK_DO:
        kind_as_str = "do";
        break;

    case TK_IN:
        kind_as_str = "in";
        break;

    case TK_PASS:
        kind_as_str = "pass";
        break;


    case TK_NEW:
        kind_as_str = "new";
        break;

    case TK_DELETE:
        kind_as_str = "delete";
        break;

    case TK_CASE:
        kind_as_str = "case";
        break;

    case TK_DEFAULT:
        kind_as_str = "default";
        break;

    case TK_WITH:
        kind_as_str = "with";
        break;

    case TK_SIZEOF:
        kind_as_str = "sizeof";
        break;


    case TK_AND:
        kind_as_str = "and";
        break;

    case TK_OR:
        kind_as_str = "or";
        break;

    case TK_NOT:
        kind_as_str = "not";
        break;


    case TK_U8:
        kind_as_str = "u8";
        break;

    case TK_U16:
        kind_as_str = "u16";
        break;

    case TK_U32:
        kind_as_str = "u32";
        break;

    case TK_U64:
        kind_as_str = "u64";
        break;

    case TK_I8:
        kind_as_str = "i8";
        break;

    case TK_I16:
        kind_as_str = "i16";
        break;

    case TK_I32:
        kind_as_str = "i32";
        break;

    case TK_I64:
        kind_as_str = "i64";
        break;


    case TK_VOID:
        kind_as_str = "void";
        break;

    case TK_SYMBOL:
        kind_as_str = "symbol";
        break;

    case TK_BOOL:
        kind_as_str = "bool";
        break;

    case TK_UCHAR:
        kind_as_str = "uchar";
        break;

    case TK_CHAR:
        kind_as_str = "char";
        break;

    case TK_USHORT:
        kind_as_str = "ushort";
        break;

    case TK_SHORT:
        kind_as_str = "short";
        break;

    case TK_UINT:
        kind_as_str = "uint";
        break;

    case TK_INT:
        kind_as_str = "int";
        break;

    case TK_ULONG:
        kind_as_str = "ulong";
        break;

    case TK_LONG:
        kind_as_str = "long";
        break;

    case TK_FLOAT:
        kind_as_str = "float";
        break;

    case TK_DOUBLE:
        kind_as_str = "double";
        break;



    /* Identifiers and literals */
    case TK_ID:
        kind_as_str = "identifier";
        break;

    case TK_TRUE:
        kind_as_str = "true";
        break;

    case TK_FALSE:
        kind_as_str = "false";
        break;

    case TK_NULL:
        kind_as_str = "null";
        break;

    case TK_LITERAL_CHAR:
        kind_as_str = "literal char";
        break;

    case TK_LITERAL_INTEGER:
        kind_as_str = "literal integer";
        break;

    case TK_LITERAL_FLOAT:
        kind_as_str = "literal float";
        break;

    case TK_LITERAL_DOUBLE:
        kind_as_str = "literal double";
        break;

    case TK_LITERAL_STRING:
        kind_as_str = "literal string";
        break;

    case TK_LITERAL_SYMBOL:
        kind_as_str = "literal symbol";
        break;


    /* Operators */

    /* arithmetic */
    case TK_PLUS:
        kind_as_str = "+";
        break;

    case TK_MINUS:
        kind_as_str = "-";
        break;

    case TK_TIMES:
        kind_as_str = "*";
        break;

    case TK_DIVISION:
        kind_as_str = "/";
        break;

    case TK_INTEGER_DIVISION:
        kind_as_str = "//";
        break;

    case TK_MODULO:
        kind_as_str = "%";
        break;

    case TK_POWER:
        kind_as_str = "**";
        break;


    case TK_INC:
        kind_as_str = "++";
        break;

    case TK_DEC:
        kind_as_str = "--";
        break;


    /* bitwise */
    case TK_BITWISE_AND:
        kind_as_str = "&";
        break;

    case TK_BITWISE_NOT:
        kind_as_str = "~";
        break;

    case TK_BITWISE_OR:
        kind_as_str = "|";
        break;

    case TK_BITWISE_XOR:
        kind_as_str = "^";
        break;

    case TK_SLL:
        kind_as_str = "<<";
        break;

    case TK_SRL:
        kind_as_str = ">>>";
        break;

    case TK_SRA:
        kind_as_str = ">>";
        break;


    /* member access operators */
    case TK_ARROW:
        kind_as_str = "->";
        break;

    case TK_DOT:
        kind_as_str = ".";
        break;


    /* scope */
    case TK_DOLAR:
        kind_as_str = "$";
        break;

    case TK_SCOPE:
        kind_as_str = "::";
        break;


    /* ranges */
    case TK_INCLUSIVE_RANGE:
        kind_as_str = "..";
        break;

    case TK_EXCLUSIVE_RANGE:
        kind_as_str = "...";
        break;


    /* relational operators */
    case TK_EQ:
        kind_as_str = "==";
        break;

    case TK_NE:
        kind_as_str = "!=";
        break;

    case TK_GT:
        kind_as_str = ">";
        break;

    case TK_LT:
        kind_as_str = "<";
        break;

    case TK_GE:
        kind_as_str = ">=";
        break;

    case TK_LE:
        kind_as_str = "<=";
        break;


    /* logical operators */
    case TK_LOGICAL_AND:
        kind_as_str = "&&";
        break;

    case TK_LOGICAL_OR:
        kind_as_str = "||";
        break;

    case TK_LOGICAL_NOT:
        kind_as_str = "!";
        break;


    /* conditional */
    case TK_TERNARY:
        kind_as_str = "?";
        break;


    /* assignments */
    case TK_ASSIGNMENT:
        kind_as_str = "=";
        break;

    case TK_BITWISE_AND_ASSIGNMENT:
        kind_as_str = "&=";
        break;

    case TK_BITWISE_XOR_ASSIGNMENT:
        kind_as_str = "^=";
        break;

    case TK_BITWISE_OR_ASSIGNMENT:
        kind_as_str = "|=";
        break;

    case TK_BITWISE_NOT_ASSIGNMENT:
        kind_as_str = "~=";
        break;

    case TK_DIVISION_ASSIGNMENT:
        kind_as_str = "/=";
        break;

    case TK_INTEGER_DIVISION_ASSIGNMENT:
        kind_as_str = "//=";
        break;

    case TK_MINUS_ASSIGNMENT:
        kind_as_str = "-=";
        break;

    case TK_MODULO_ASSIGNMENT:
        kind_as_str = "%=";
        break;

    case TK_PLUS_ASSIGNMENT:
        kind_as_str = "+=";
        break;

    case TK_TIMES_ASSIGNMENT:
        kind_as_str = "*=";
        break;

    case TK_SLL_ASSIGNMENT:
        kind_as_str = "<<=";
        break;

    case TK_SRA_ASSIGNMENT:
        kind_as_str = ">>=";
        break;

    case TK_SRL_ASSIGNMENT:
        kind_as_str = ">>>=";
        break;

    case TK_SPECIAL_ASSIGNMENT:
        kind_as_str = ":=";
        break;


    /* others */
    case TK_HASH_ARROW:
        kind_as_str = "=>";
        break;


    /* punctuation */
    case TK_NEWLINE:
        kind_as_str = "\\n";
        break;

    case TK_EOF:
        kind_as_str = "EOF";
        break;

    case TK_AT:
        kind_as_str = "@";
        break;

    case TK_BEGIN:
        kind_as_str = "begin";
        break;

    case TK_END:
        kind_as_str = "end";
        break;

    case TK_COLON:
        kind_as_str = ":";
        break;

    case TK_COMMA:
        kind_as_str = ",";
        break;

    case TK_SEMICOLON:
        kind_as_str = ";";
        break;

    case TK_LEFT_CURLY_BRACKET:
        kind_as_str = "{";
        break;

    case TK_LEFT_PARENTHESIS:
        kind_as_str = "(";
        break;

    case TK_LEFT_SQUARE_BRACKET:
        kind_as_str = "[";
        break;

    case TK_RIGHT_CURLY_BRACKET:
        kind_as_str = "}";
        break;

    case TK_RIGHT_PARENTHESIS:
        kind_as_str = ")";
        break;

    case TK_RIGHT_SQUARE_BRACKET:
        kind_as_str = "]";
        break;
    }

    return kind_as_str;
}